

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluxDecoder.cpp
# Opt level: O2

void __thiscall
FluxDecoder::FluxDecoder
          (FluxDecoder *this,FluxData *flux_revs,int bitcell_ns,int flux_scale_percent,
          int pll_adjust)

{
  pointer pvVar1;
  
  this->m_flux_revs = flux_revs;
  (this->m_rev_it)._M_current = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  (this->m_flux_it)._M_current = (uint *)0x0;
  this->m_clock = bitcell_ns;
  this->m_clock_centre = bitcell_ns;
  this->m_clock_min = ((100 - pll_adjust) * bitcell_ns) / 100;
  this->m_clock_max = ((pll_adjust + 100) * bitcell_ns) / 100;
  this->m_flux = 0;
  this->m_clocked_zeros = 0;
  this->m_flux_scale_percent = flux_scale_percent;
  this->m_pll_adjust = pll_adjust;
  this->m_goodbits = 0;
  this->m_index = false;
  this->m_sync_lost = false;
  pvVar1 = (flux_revs->
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((flux_revs->
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pvVar1) {
    (this->m_rev_it)._M_current = pvVar1;
    (this->m_flux_it)._M_current =
         (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
         super__Vector_impl_data._M_start;
    return;
  }
  __assert_fail("flux_revs.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/FluxDecoder.cpp"
                ,0xf,"FluxDecoder::FluxDecoder(const FluxData &, int, int, int)");
}

Assistant:

FluxDecoder::FluxDecoder(const FluxData& flux_revs, int bitcell_ns, int flux_scale_percent, int pll_adjust)
    : m_flux_revs(flux_revs), m_clock(bitcell_ns), m_clock_centre(bitcell_ns),
    m_clock_min(bitcell_ns* (100 - pll_adjust) / 100),
    m_clock_max(bitcell_ns* (100 + pll_adjust) / 100),
    m_flux_scale_percent(flux_scale_percent),
    m_pll_adjust(pll_adjust)
{
    assert(flux_revs.size());

    m_rev_it = m_flux_revs.cbegin();
    m_flux_it = (*m_rev_it).cbegin();
}